

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c++
# Opt level: O1

Validity * __thiscall
kj::TestRunner::setFilter(Validity *__return_storage_ptr__,TestRunner *this,StringPtr pattern)

{
  uint *puVar1;
  RemoveConst<unsigned_int> *pRVar2;
  uint *puVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar8;
  char *pcVar9;
  uint uVar10;
  char *__nptr;
  long lVar11;
  size_t sVar12;
  size_t sVar13;
  bool bVar14;
  StringPtr name;
  GlobFilter filter;
  uint local_7c;
  GlobFilter local_68;
  ulong uVar7;
  
  pcVar9 = pattern.content.ptr;
  this->hasFilter = true;
  sVar12 = pattern.content.size_ - 1;
  sVar4 = sVar12;
  do {
    sVar13 = sVar4;
    if (sVar13 == 0) break;
    sVar4 = sVar13 - 1;
  } while (pcVar9[sVar13 - 1] != ':');
  if (sVar13 == 0) {
    local_7c = 0xffffffff;
    uVar10 = 0;
    goto LAB_00499d99;
  }
  uVar6 = strtoul(pcVar9 + sVar13,(char **)&local_68,0);
  if (local_68.pattern.content.ptr == pcVar9 + sVar13) {
LAB_00499d71:
    bVar14 = false;
    uVar5 = 0xffffffff;
  }
  else if (*local_68.pattern.content.ptr == '\0') {
    bVar14 = true;
    uVar5 = (uint)uVar6;
  }
  else {
    if (*local_68.pattern.content.ptr != '-') goto LAB_00499d71;
    __nptr = local_68.pattern.content.ptr + 1;
    bVar14 = false;
    uVar7 = strtoul(__nptr,(char **)&local_68,0);
    uVar5 = (uint)uVar7;
    if (__nptr < local_68.pattern.content.ptr) {
      bVar14 = *local_68.pattern.content.ptr == '\0';
    }
  }
  uVar10 = 0;
  local_7c = 0xffffffff;
  if (bVar14) {
    sVar12 = sVar13 - 1;
    uVar10 = (uint)uVar6;
    local_7c = uVar5;
  }
LAB_00499d99:
  heapString(&local_68.pattern,pcVar9,sVar12);
  local_68.states.builder.ptr = (uint *)0x0;
  local_68.states.builder.pos = (RemoveConst<unsigned_int> *)0x0;
  local_68.states.builder.endPtr = (uint *)0x0;
  if ((anonymous_namespace)::testCasesHead != 0) {
    lVar11 = (anonymous_namespace)::testCasesHead;
    do {
      if (*(char *)(lVar11 + 0x30) == '\0') {
        pcVar9 = *(char **)(lVar11 + 8);
        sVar8 = strlen(pcVar9);
        name.content.size_ = sVar8 + 1;
        name.content.ptr = pcVar9;
        bVar14 = kj::_::GlobFilter::matches(&local_68,name);
        if (((bVar14) && (uVar10 <= *(uint *)(lVar11 + 0x10))) &&
           (*(uint *)(lVar11 + 0x10) <= local_7c)) {
          *(undefined1 *)(lVar11 + 0x30) = 1;
        }
      }
      lVar11 = *(long *)(lVar11 + 0x20);
    } while (lVar11 != 0);
  }
  puVar3 = local_68.states.builder.endPtr;
  pRVar2 = local_68.states.builder.pos;
  puVar1 = local_68.states.builder.ptr;
  (__return_storage_ptr__->errorMessage).ptr.isSet = false;
  if (local_68.states.builder.ptr != (uint *)0x0) {
    local_68.states.builder.ptr = (uint *)0x0;
    local_68.states.builder.pos = (RemoveConst<unsigned_int> *)0x0;
    local_68.states.builder.endPtr = (uint *)0x0;
    (**(local_68.states.builder.disposer)->_vptr_ArrayDisposer)
              (local_68.states.builder.disposer,puVar1,4,(long)pRVar2 - (long)puVar1 >> 2,
               (long)puVar3 - (long)puVar1 >> 2,0);
  }
  sVar12 = local_68.pattern.content.size_;
  pcVar9 = local_68.pattern.content.ptr;
  if (local_68.pattern.content.ptr != (char *)0x0) {
    local_68.pattern.content.ptr = (char *)0x0;
    local_68.pattern.content.size_ = 0;
    (**(local_68.pattern.content.disposer)->_vptr_ArrayDisposer)
              (local_68.pattern.content.disposer,pcVar9,1,sVar12,sVar12,0);
  }
  return __return_storage_ptr__;
}

Assistant:

MainBuilder::Validity setFilter(StringPtr pattern) {
    hasFilter = true;
    ArrayPtr<const char> filePattern = pattern;
    uint minLine = kj::minValue;
    uint maxLine = kj::maxValue;

    KJ_IF_MAYBE(colonPos, pattern.findLast(':')) {
      char* end;
      StringPtr lineStr = pattern.slice(*colonPos + 1);

      bool parsedRange = false;
      minLine = strtoul(lineStr.cStr(), &end, 0);
      if (end != lineStr.begin()) {
        if (*end == '-') {
          // A range.
          const char* part2 = end + 1;
          maxLine = strtoul(part2, &end, 0);
          if (end > part2 && *end == '\0') {
            parsedRange = true;
          }
        } else if (*end == '\0') {
          parsedRange = true;
          maxLine = minLine;
        }
      }

      if (parsedRange) {
        // We have an exact line number.
        filePattern = pattern.slice(0, *colonPos);
      } else {
        // Can't parse as a number. Maybe the colon is part of a Windows path name or something.
        // Let's just keep it as part of the file pattern.
        minLine = kj::minValue;
        maxLine = kj::maxValue;
      }
    }

    _::GlobFilter filter(filePattern);

    for (TestCase* testCase = testCasesHead; testCase != nullptr; testCase = testCase->next) {
      if (!testCase->matchedFilter && filter.matches(testCase->file) &&
          testCase->line >= minLine && testCase->line <= maxLine) {
        testCase->matchedFilter = true;
      }
    }

    return true;
  }